

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftglyph.c
# Opt level: O0

FT_Error ft_svg_glyph_copy(FT_Glyph svg_source,FT_Glyph svg_target)

{
  FT_Memory memory_00;
  FT_Library pFVar1;
  FT_Memory memory;
  FT_Glyph pFStack_28;
  FT_Error error;
  FT_SvgGlyph target;
  FT_SvgGlyph source;
  FT_Glyph svg_target_local;
  FT_Glyph svg_source_local;
  
  memory._4_4_ = 0;
  memory_00 = svg_source->library->memory;
  if (svg_source->format == FT_GLYPH_FORMAT_SVG) {
    if (svg_source[1].clazz == (FT_Glyph_Class *)0x0) {
      memory._4_4_ = 0x25;
    }
    else {
      svg_target[1].format = svg_source[1].format;
      svg_target[1].clazz = svg_source[1].clazz;
      pFStack_28 = svg_target;
      target = (FT_SvgGlyph)svg_source;
      source = (FT_SvgGlyph)svg_target;
      svg_target_local = svg_source;
      memcpy(&svg_target[1].advance,&svg_source[1].advance,0x38);
      *(FT_UShort *)&pFStack_28[3].library = target->units_per_EM;
      *(FT_UShort *)((long)&pFStack_28[3].library + 2) = target->start_glyph_id;
      *(FT_UShort *)((long)&pFStack_28[3].library + 4) = target->end_glyph_id;
      pFStack_28[3].clazz = (FT_Glyph_Class *)(target->transform).xx;
      *(FT_Fixed *)&pFStack_28[3].format = (target->transform).xy;
      pFStack_28[3].advance.x = (target->transform).yx;
      pFStack_28[3].advance.y = (target->transform).yy;
      pFStack_28[4].library = (FT_Library)(target->delta).x;
      pFStack_28[4].clazz = (FT_Glyph_Class *)(target->delta).y;
      pFVar1 = (FT_Library)
               ft_mem_qalloc(memory_00,(FT_Long)pFStack_28[1].clazz,(FT_Error *)((long)&memory + 4))
      ;
      pFStack_28[1].library = pFVar1;
      if (memory._4_4_ == 0) {
        memcpy(pFStack_28[1].library,target->svg_document,(size_t)pFStack_28[1].clazz);
      }
    }
  }
  else {
    memory._4_4_ = 0x12;
  }
  return memory._4_4_;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  ft_svg_glyph_copy( FT_Glyph  svg_source,
                     FT_Glyph  svg_target )
  {
    FT_SvgGlyph  source = (FT_SvgGlyph)svg_source;
    FT_SvgGlyph  target = (FT_SvgGlyph)svg_target;

    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = FT_GLYPH( source )->library->memory;


    if ( svg_source->format != FT_GLYPH_FORMAT_SVG )
    {
      error = FT_THROW( Invalid_Glyph_Format );
      goto Exit;
    }

    if ( source->svg_document_length == 0 )
    {
      error = FT_THROW( Invalid_Slot_Handle );
      goto Exit;
    }

    target->glyph_index = source->glyph_index;

    target->svg_document_length = source->svg_document_length;

    target->metrics      = source->metrics;
    target->units_per_EM = source->units_per_EM;

    target->start_glyph_id = source->start_glyph_id;
    target->end_glyph_id   = source->end_glyph_id;

    target->transform = source->transform;
    target->delta     = source->delta;

    /* allocate space for the SVG document */
    if ( FT_QALLOC( target->svg_document, target->svg_document_length ) )
      goto Exit;

    /* copy the document */
    FT_MEM_COPY( target->svg_document,
                 source->svg_document,
                 target->svg_document_length );

  Exit:
    return error;
  }